

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O2

void Lib::List<Inferences::ALASCA::SuperpositionConf::Rhs>::push
               (Rhs *elem,List<Inferences::ALASCA::SuperpositionConf::Rhs> **lst)

{
  List<Inferences::ALASCA::SuperpositionConf::Rhs> *pLVar1;
  Rhs RStack_58;
  
  Inferences::ALASCA::SuperpositionConf::Rhs::Rhs(&RStack_58,elem);
  pLVar1 = cons(&RStack_58,*lst);
  *lst = pLVar1;
  return;
}

Assistant:

static void push(C elem,List* &lst)
  {
    lst = cons(elem, lst);
  }